

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::FindUndoPos
          (BlockManager *this,BlockValidationState *state,int nFile,FlatFilePos *pos,uint nAddSize)

{
  long lVar1;
  ConstevalStringLiteral str;
  bool bVar2;
  reference pvVar3;
  size_t sVar4;
  undefined4 *in_RCX;
  undefined4 in_EDX;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  size_t bytes_allocated;
  bool out_of_space;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  BlockManager *in_stack_fffffffffffffef8;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  __pthread_internal_list *notifications;
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  bool *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  FlatFilePos *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  bool local_6e;
  byte local_6d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = in_EDX;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            (&in_stack_fffffffffffffef8->cs_LastBlockFile);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),in_RDI,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  pvVar3 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                     ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                      in_stack_ffffffffffffff08,
                      CONCAT17(in_stack_ffffffffffffff07,
                               CONCAT16(in_stack_ffffffffffffff06,
                                        CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00
                                                ))));
  in_RCX[1] = pvVar3->nUndoSize;
  iVar5 = in_R8D;
  pvVar3 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                     ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                      in_stack_ffffffffffffff08,
                      CONCAT17(in_stack_ffffffffffffff07,
                               CONCAT16(in_stack_ffffffffffffff06,
                                        CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00
                                                ))));
  pvVar3->nUndoSize = pvVar3->nUndoSize + in_R8D;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            (in_stack_ffffffffffffff08,
             (value_type_conflict2 *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))));
  sVar4 = FlatFileSeq::Allocate
                    ((FlatFileSeq *)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((local_6d & 1) == 0) {
    if ((sVar4 != 0) && (bVar2 = IsPruneMode(in_stack_fffffffffffffef8), bVar2)) {
      in_RDI[2].super_recursive_mutex.super___recursive_mutex_base._M_mutex.__size[8] = '\x01';
    }
    local_6e = true;
  }
  else {
    notifications =
         in_RDI[8].super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev;
    str.lit._4_4_ = in_stack_ffffffffffffff4c;
    str.lit._0_4_ = in_stack_ffffffffffffff48;
    ::_(str);
    local_6e = FatalError((Notifications *)notifications,
                          (BlockValidationState *)
                          CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT15(in_stack_ffffffffffffff05,
                                                     in_stack_ffffffffffffff00))),
                          (bilingual_str *)in_stack_fffffffffffffef8);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffef8);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_6e;
}

Assistant:

bool BlockManager::FindUndoPos(BlockValidationState& state, int nFile, FlatFilePos& pos, unsigned int nAddSize)
{
    pos.nFile = nFile;

    LOCK(cs_LastBlockFile);

    pos.nPos = m_blockfile_info[nFile].nUndoSize;
    m_blockfile_info[nFile].nUndoSize += nAddSize;
    m_dirty_fileinfo.insert(nFile);

    bool out_of_space;
    size_t bytes_allocated = m_undo_file_seq.Allocate(pos, nAddSize, out_of_space);
    if (out_of_space) {
        return FatalError(m_opts.notifications, state, _("Disk space is too low!"));
    }
    if (bytes_allocated != 0 && IsPruneMode()) {
        m_check_for_pruning = true;
    }

    return true;
}